

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,Option *opt
               )

{
  Layer *pLVar1;
  ParamDict pd;
  
  pLVar1 = create_layer(0x2b);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,top);
  ParamDict::set(&pd,1,bottom);
  ParamDict::set(&pd,2,left);
  ParamDict::set(&pd,3,right);
  ParamDict::set(&pd,4,type);
  ParamDict::set(&pd,5,v);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, const Option& opt)
{
    ncnn::Layer* padding = ncnn::create_layer(ncnn::LayerType::Padding);

    ncnn::ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    padding->forward(src, dst, opt);

    delete padding;
}